

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryFileManager::SetMaxSwapSpace(TemporaryFileManager *this,optional_idx limit)

{
  StringUtil *this_00;
  StringUtil *this_01;
  idx_t iVar1;
  ulong uVar2;
  OutOfMemoryException *this_02;
  idx_t in_RCX;
  undefined1 auVar3 [16];
  double dVar4;
  allocator local_c1;
  optional_idx limit_local;
  optional_idx disk_space;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string max;
  
  limit_local = limit;
  if (limit.index == 0xffffffffffffffff) {
    disk_space = FileSystem::GetAvailableDiskSpace(&this->temp_directory);
    if (disk_space.index == 0xffffffffffffffff) {
      this_01 = (StringUtil *)0xfffffffffffffffe;
    }
    else {
      iVar1 = optional_idx::GetIndex(&disk_space);
      auVar3._8_4_ = (int)(iVar1 >> 0x20);
      auVar3._0_8_ = iVar1;
      auVar3._12_4_ = 0x45300000;
      dVar4 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0)) * 0.9;
      uVar2 = (ulong)dVar4;
      in_RCX = (long)uVar2 >> 0x3f;
      this_01 = (StringUtil *)((long)(dVar4 - 9.223372036854776e+18) & in_RCX | uVar2);
    }
  }
  else {
    this_01 = (StringUtil *)optional_idx::GetIndex(&limit_local);
  }
  this_00 = (StringUtil *)(this->size_on_disk->super___atomic_base<unsigned_long>)._M_i;
  if (this_00 <= this_01) {
    this->max_swap_space = (idx_t)this_01;
    return;
  }
  StringUtil::BytesToHumanReadableString_abi_cxx11_((string *)&disk_space,this_00,0x400,in_RCX);
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&max,this_01,0x400,in_RCX);
  this_02 = (OutOfMemoryException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,
             "failed to adjust the \'max_temp_directory_size\', currently used space (%s) exceeds the new limit (%s)\nPlease increase the limit or destroy the buffers stored in the temp directory by e.g removing temporary tables.\nTo get usage information of the temp_directory, use \'CALL duckdb_temporary_files();\'\n\t\t"
             ,&local_c1);
  ::std::__cxx11::string::string((string *)&local_78,(string *)&disk_space);
  ::std::__cxx11::string::string((string *)&local_98,(string *)&max);
  OutOfMemoryException::OutOfMemoryException<std::__cxx11::string,std::__cxx11::string>
            (this_02,&local_58,&local_78,&local_98);
  __cxa_throw(this_02,&OutOfMemoryException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TemporaryFileManager::SetMaxSwapSpace(optional_idx limit) {
	idx_t new_limit;
	if (limit.IsValid()) {
		new_limit = limit.GetIndex();
	} else {
		new_limit = GetDefaultMax(temp_directory);
	}

	auto current_size_on_disk = GetTotalUsedSpaceInBytes();
	if (current_size_on_disk > new_limit) {
		auto used = StringUtil::BytesToHumanReadableString(current_size_on_disk);
		auto max = StringUtil::BytesToHumanReadableString(new_limit);
		throw OutOfMemoryException(
		    R"(failed to adjust the 'max_temp_directory_size', currently used space (%s) exceeds the new limit (%s)
Please increase the limit or destroy the buffers stored in the temp directory by e.g removing temporary tables.
To get usage information of the temp_directory, use 'CALL duckdb_temporary_files();'
		)",
		    used, max);
	}
	max_swap_space = new_limit;
}